

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

int __thiscall
slang::IntervalMapDetails::
NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_8U>::
adjustFromLeftSib(NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_8U>
                  *this,uint32_t size,
                 NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_8U>
                 *sib,uint32_t sibSize,int toAdd)

{
  uint32_t count;
  
  if (toAdd < 1) {
    count = -toAdd;
    if (size <= (uint)-toAdd) {
      count = size;
    }
    if (8 - sibSize < count) {
      count = 8 - sibSize;
    }
    transferToLeftSib(this,size,sib,sibSize,count);
    toAdd = -count;
  }
  else {
    if (sibSize < (uint)toAdd) {
      toAdd = sibSize;
    }
    if (8 - size < (uint)toAdd) {
      toAdd = 8 - size;
    }
    transferToRightSib(sib,sibSize,this,size,toAdd);
  }
  return toAdd;
}

Assistant:

int adjustFromLeftSib(uint32_t size, NodeBase& sib, uint32_t sibSize, int toAdd) {
        if (toAdd > 0) {
            // Copy from sibling.
            uint32_t count = std::min(std::min(uint32_t(toAdd), sibSize), Capacity - size);
            sib.transferToRightSib(sibSize, *this, size, count);
            return int(count);
        }
        else {
            // Copy to sibling.
            uint32_t count = std::min(std::min(uint32_t(-toAdd), size), Capacity - sibSize);
            transferToLeftSib(size, sib, sibSize, count);
            return -int(count);
        }
    }